

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

uint32_t hash_string_obj(ObjString *string)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (string->hashed != true) {
    if (string->length == 0) {
      uVar1 = 0x1505;
    }
    else {
      uVar1 = 0x1505;
      uVar2 = 1;
      uVar3 = 0;
      do {
        uVar1 = uVar1 * 0x21 ^ (int)string->start[uVar3];
        uVar3 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
      } while (uVar3 < string->length);
    }
    string->hash = uVar1;
    string->hashed = true;
    return uVar1;
  }
  return string->hash;
}

Assistant:

uint32_t hash_string_obj(ObjString *string) {
    if (string->hashed) {
        return string->hash;
    }

    uint32_t hash = hash_string(string->start, string->length);

    string->hash = hash;
    string->hashed = true;

    return hash;
}